

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c++
# Opt level: O2

unsigned_long_long kj::anon_unknown_39::parseUnsigned(StringPtr *s,unsigned_long_long max)

{
  bool bVar1;
  int *piVar2;
  Fault *this;
  char *pcVar3;
  int iVar4;
  Fault f_1;
  unsigned_long_long value;
  char *endPtr;
  unsigned_long_long max_local;
  
  this = &f_1;
  max_local = max;
  if ((s->content).size_ < 2) {
    pcVar3 = "s != nullptr";
    this = (Fault *)&endPtr;
    iVar4 = 0x37;
  }
  else {
    piVar2 = __errno_location();
    *piVar2 = 0;
    pcVar3 = (s->content).ptr;
    bVar1 = isHex(pcVar3);
    iVar4 = 10;
    if (bVar1) {
      iVar4 = 0x10;
    }
    value = strtoull(pcVar3,&endPtr,iVar4);
    pcVar3 = (s->content).ptr;
    if (endPtr == pcVar3 + ((s->content).size_ - 1)) {
      if (*piVar2 == 0x22) {
        pcVar3 = "errno != ERANGE";
        iVar4 = 0x3c;
      }
      else {
        if (max < value) {
          _::Debug::Fault::
          Fault<kj::Exception::Type,char_const(&)[19],unsigned_long_long&,unsigned_long_long&>
                    (&f_1,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/string.c++"
                     ,0x3d,FAILED,"value <= max","\"Value out-of-range\", value, max",
                     (char (*) [19])"Value out-of-range",&value,&max_local);
          this = &f_1;
          goto LAB_00303dc8;
        }
        if (*pcVar3 != '-') {
          return value;
        }
        pcVar3 = "s[0] != \'-\'";
        iVar4 = 0x3f;
      }
      _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[19],kj::StringPtr_const&>
                (&f_1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/string.c++"
                 ,iVar4,FAILED,pcVar3,"\"Value out-of-range\", s",
                 (char (*) [19])"Value out-of-range",s);
      goto LAB_00303dc8;
    }
    pcVar3 = "endPtr == s.end()";
    iVar4 = 0x3b;
    this = &f_1;
  }
  _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[37],kj::StringPtr_const&>
            (this,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/string.c++"
             ,iVar4,FAILED,pcVar3,"\"String does not contain valid number\", s",
             (char (*) [37])"String does not contain valid number",s);
LAB_00303dc8:
  _::Debug::Fault::~Fault(this);
  return 0;
}

Assistant:

unsigned long long parseUnsigned(const StringPtr& s, unsigned long long max) {
  KJ_REQUIRE(s != nullptr, "String does not contain valid number", s) { return 0; }
  char *endPtr;
  errno = 0;
  auto value = strtoull(s.begin(), &endPtr, isHex(s.cStr()) ? 16 : 10);
  KJ_REQUIRE(endPtr == s.end(), "String does not contain valid number", s) { return 0; }
  KJ_REQUIRE(errno != ERANGE, "Value out-of-range", s) { return 0; }
  KJ_REQUIRE(value <= max, "Value out-of-range", value, max) { return 0; }
  //strtoull("-1") does not fail with ERANGE
  KJ_REQUIRE(s[0] != '-', "Value out-of-range", s) { return 0; }
  return value;
}